

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrappedValue.cpp
# Opt level: O0

QString * __thiscall WrappedValue::toQString(QString *__return_storage_ptr__,WrappedValue *this)

{
  undefined8 uVar1;
  QVariant local_d8;
  QString local_b8;
  string local_a0;
  QString local_80;
  undefined1 local_61;
  uint64_t local_60;
  uint64_t num;
  ulong uStack_50;
  bool isOk;
  bufsize_t size;
  undefined1 local_38 [8];
  QVariant val;
  WrappedValue *this_local;
  QString *out;
  
  val.d._24_8_ = this;
  if (this->m_Type == NONE) {
    QString::QString(__return_storage_ptr__,"");
  }
  else if (this->m_Type == COMPLEX) {
    QString::QString(__return_storage_ptr__,"...");
  }
  else {
    getQVariant((QVariant *)local_38,this);
    if ((this->m_Type == STRING) || (this->m_Type == WSTRING)) {
      QVariant::toString();
    }
    else if (this->m_Type == INT) {
      uStack_50 = this->m_Size;
      if (uStack_50 < 9) {
        num._7_1_ = 0;
        local_60 = AbstractByteBuffer::getNumValue
                             (this->m_Owner,this->m_Offset,this->m_Size,(bool *)((long)&num + 7));
        if ((num._7_1_ & 1) == 0) {
          QString::QString(__return_storage_ptr__,"INVALID");
        }
        else {
          local_61 = 0;
          QString::QString(__return_storage_ptr__);
          (**this->_vptr_WrappedValue)(&local_b8);
          QString::toStdString_abi_cxx11_(&local_a0,&local_b8);
          uVar1 = std::__cxx11::string::c_str();
          QString::asprintf((char *)&local_80,uVar1,local_60);
          QString::operator=(__return_storage_ptr__,&local_80);
          QString::~QString(&local_80);
          std::__cxx11::string::~string((string *)&local_a0);
          QString::~QString(&local_b8);
          local_61 = 1;
        }
      }
      else {
        QString::QString(__return_storage_ptr__,"...");
      }
    }
    else {
      getQVariant(&local_d8,this);
      QVariant::toString();
      QVariant::~QVariant(&local_d8);
    }
    size._0_4_ = 1;
    QVariant::~QVariant((QVariant *)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

QString WrappedValue::toQString()
{
    if (this->m_Type == NONE) return "";
    if (this->m_Type == COMPLEX) return "...";

    QVariant val = getQVariant();

    if (this->m_Type == STRING || this->m_Type == WSTRING) {
        return val.toString();
    }
    if (this->m_Type == INT) {

        bufsize_t size = this->m_Size;
        if (size > sizeof(uint64_t)) return  "...";

        bool isOk = false;
        uint64_t num = m_Owner->getNumValue(m_Offset, m_Size, &isOk);
        if (!isOk) return "INVALID";
        QString out;
#if QT_VERSION >= 0x050000
        out = QString::asprintf(getIntFormat().toStdString().c_str(), num);
#else
        out.sprintf(getIntFormat().toStdString().c_str(), num);
#endif
        return out;
    }
    return getQVariant().toString();
}